

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
* __thiscall
phmap::priv::
node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
::operator=(node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
            *this,node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                  *other)

{
  if ((this->alloc_).super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == true) {
    (this->alloc_).super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
  }
  if ((other->alloc_).super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == true) {
    (this->alloc_).super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = true;
    if ((other->alloc_).super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
        super__Optional_payload<std::allocator<int>,_true,_false,_false>.
        super__Optional_payload_base<std::allocator<int>_>._M_engaged == false) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xb09,
                    "slot_type *phmap::priv::node_handle_base<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>, std::allocator<int>>::slot() const [PolicyTraits = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>, Alloc = std::allocator<int>]"
                   );
    }
    *(undefined4 *)(this->slot_space_).data = *(undefined4 *)(other->slot_space_).data;
    (other->alloc_).super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
  }
  return this;
}

Assistant:

void destroy() {
        if (!empty()) {
            PolicyTraits::destroy(alloc(), slot());
            reset();
        }
    }